

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O0

void idx2::ExtrapolateCdf53(v3i *Dims3,u64 TransformOrder,volume *Vol)

{
  u64 uVar1;
  long lVar2;
  undefined1 auVar3 [8];
  char local_129;
  int local_128;
  int local_124;
  int local_120;
  int local_118;
  int local_110;
  undefined1 local_104 [4];
  int NLevels;
  v3i M3;
  undefined1 local_e4 [8];
  v3i N3;
  volume *Vol_local;
  u64 TransformOrder_local;
  v3i *Dims3_local;
  undefined8 local_38;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 *local_20;
  undefined1 local_11;
  ulong local_10;
  
  uVar1 = Vol->Dims;
  local_24 = ((int)uVar1 << 0xb) >> 0xb;
  local_20 = &local_38;
  local_28 = (int)((long)(uVar1 << 0x16) >> 0x2b);
  N3.field_0.field_0.X = (int)((long)(uVar1 * 2) >> 0x2b);
  local_38._0_4_ = local_24;
  local_38._4_4_ = local_28;
  M3.field_0._4_8_ = local_38;
  local_e4 = (undefined1  [8])local_38;
  auVar3 = local_e4;
  local_e4._0_4_ = (undefined4)local_38;
  if (local_e4._0_4_ == 1) {
    local_110 = 1;
  }
  else {
    local_110 = local_e4._0_4_ + -1;
  }
  local_e4._4_4_ = (undefined4)((ulong)local_38 >> 0x20);
  if (local_e4._4_4_ == 1) {
    local_118 = 1;
  }
  else {
    local_118 = local_e4._4_4_ + -1;
  }
  if (N3.field_0.field_0.X == 1) {
    local_120 = 1;
  }
  else {
    local_120 = N3.field_0.field_0.X + -1;
  }
  local_104 = (undefined1  [4])local_110;
  NLevels = local_118;
  M3.field_0.field_0.X = local_120;
  if ((int)local_e4._0_4_ < (int)local_e4._4_4_) {
    local_124 = local_e4._4_4_;
  }
  else {
    local_124 = local_e4._0_4_;
  }
  local_128 = N3.field_0.field_0.X;
  if (N3.field_0.field_0.X <= local_124) {
    local_128 = local_124;
  }
  local_10 = (ulong)local_128;
  local_11 = 0xff;
  if (local_10 == 0) {
    local_129 = -1;
  }
  else {
    lVar2 = 0x3f;
    if (local_10 != 0) {
      for (; local_10 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    local_129 = '?' - ((byte)lVar2 ^ 0x3f);
  }
  local_e4 = auVar3;
  N3.field_0.field_4.YZ.field_0 = (v2<int>)Vol;
  local_2c = N3.field_0.field_0.X;
  ForwardCdf53(Dims3,(v3i *)local_104,0,(int)local_129,TransformOrder,Vol,false);
  InverseCdf53((v3i *)local_e4,(v3i *)local_104,0,(int)local_129,TransformOrder,
               (volume *)N3.field_0.field_4.YZ.field_0,false);
  return;
}

Assistant:

void
ExtrapolateCdf53(const v3i& Dims3, u64 TransformOrder, volume* Vol)
{
  v3i N3 = Dims(*Vol);
  v3i M3(N3.X == 1 ? 1 : N3.X - 1, N3.Y == 1 ? 1 : N3.Y - 1, N3.Z == 1 ? 1 : N3.Z - 1);
  // printf("M3 = " idx2_PrStrV3i "\n", idx2_PrV3i(M3));
  idx2_Assert(IsPow2(M3.X) && IsPow2(M3.Y) && IsPow2(M3.Z));
  int NLevels = Log2Floor(Max(Max(N3.X, N3.Y), N3.Z));
  ForwardCdf53(Dims3, M3, 0, NLevels, TransformOrder, Vol);
  InverseCdf53(N3, M3, 0, NLevels, TransformOrder, Vol);
}